

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O2

void sptk::world::InitializeForwardRealFFT(int fft_size,ForwardRealFFT *forward_real_fft)

{
  undefined8 uVar1;
  ulong uVar2;
  double *in;
  fft_complex *out;
  long lVar3;
  fft_plan *pfVar4;
  fft_plan *pfVar5;
  ulong uVar6;
  byte bVar7;
  fft_plan fStack_68;
  
  bVar7 = 0;
  forward_real_fft->fft_size = fft_size;
  uVar6 = (long)fft_size << 4;
  uVar2 = (long)fft_size * 8;
  if (fft_size < 0) {
    uVar6 = 0xffffffffffffffff;
    uVar2 = 0xffffffffffffffff;
  }
  in = (double *)operator_new__(uVar2);
  forward_real_fft->waveform = in;
  out = (fft_complex *)operator_new__(uVar6);
  forward_real_fft->spectrum = out;
  fft_plan_dft_r2c_1d(&fStack_68,fft_size,in,out,3);
  pfVar4 = &fStack_68;
  pfVar5 = &forward_real_fft->forward_fft;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *(undefined8 *)pfVar4;
    pfVar5->n = (int)uVar1;
    pfVar5->sign = (int)((ulong)uVar1 >> 0x20);
    pfVar4 = (fft_plan *)((long)pfVar4 + ((ulong)bVar7 * -2 + 1) * 8);
    pfVar5 = (fft_plan *)((long)pfVar5 + (ulong)bVar7 * -0x10 + 8);
  }
  return;
}

Assistant:

void InitializeForwardRealFFT(int fft_size, ForwardRealFFT *forward_real_fft) {
  forward_real_fft->fft_size = fft_size;
  forward_real_fft->waveform = new double[fft_size];
  forward_real_fft->spectrum = new fft_complex[fft_size];
  forward_real_fft->forward_fft = fft_plan_dft_r2c_1d(fft_size,
      forward_real_fft->waveform, forward_real_fft->spectrum, FFT_ESTIMATE);
}